

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makemon.c
# Opt level: O0

boolean monclass_nogen(char monclass)

{
  bool bVar1;
  int local_14;
  int local_10;
  int i;
  int first;
  char monclass_local;
  
  local_10 = 0;
  while ((local_10 < 0x158 && (mons[local_10].mlet != monclass))) {
    local_10 = local_10 + 1;
  }
  if (local_10 != 0x158) {
    local_14 = local_10;
    while( true ) {
      bVar1 = false;
      if (local_14 < 0x158) {
        bVar1 = mons[local_14].mlet == monclass;
      }
      if (!bVar1) {
        return '\x01';
      }
      if ((mons[local_14].geno & 0x200) == 0) break;
      local_14 = local_14 + 1;
    }
  }
  return '\0';
}

Assistant:

boolean monclass_nogen(char monclass)
{
	int first, i;

/*	Assumption #1:	monsters of a given class are contiguous in the
 *			mons[] array.
 */
	for (first = LOW_PM; first < SPECIAL_PM; first++)
	    if (mons[first].mlet == monclass) break;
	if (first == SPECIAL_PM) return FALSE;

	for (i = first; i < SPECIAL_PM && mons[i].mlet == monclass; i++)
	    if (!(mons[i].geno & G_NOGEN)) return FALSE;
	return TRUE;
}